

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
TransformPromiseNode<int,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:91:7),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<int,_kj::_::Void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:91:7),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  void *__src;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ExceptionOr<kj::_::Void> depResult;
  Fault f;
  ExceptionOr<int> local_5b8;
  ExceptionOrValue local_450;
  char local_2f0;
  Exception local_2e8;
  Exception local_188;
  
  local_450.exception.ptr.isSet = false;
  local_2f0 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_450);
  uVar5 = local_450.exception.ptr.field_1.value.context.ptr.ptr;
  uVar4 = local_450.exception.ptr.field_1.value.description.content.size_;
  uVar3 = local_450.exception.ptr.field_1.value.description.content.ptr;
  uVar2 = local_450.exception.ptr.field_1.value.ownFile.content.size_;
  uVar1 = local_450.exception.ptr.field_1.value.ownFile.content.ptr;
  if (local_450.exception.ptr.isSet == true) {
    __src = (void *)((long)&local_450.exception.ptr.field_1 + 0x50);
    local_188.ownFile.content.ptr = local_450.exception.ptr.field_1.value.ownFile.content.ptr;
    local_188.ownFile.content.size_ = local_450.exception.ptr.field_1.value.ownFile.content.size_;
    local_188.ownFile.content.disposer =
         local_450.exception.ptr.field_1.value.ownFile.content.disposer;
    local_450.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_450.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_188.file = local_450.exception.ptr.field_1.value.file;
    local_188.line = local_450.exception.ptr.field_1.value.line;
    local_188.type = local_450.exception.ptr.field_1.value.type;
    local_188.description.content.ptr =
         local_450.exception.ptr.field_1.value.description.content.ptr;
    local_188.description.content.size_ =
         local_450.exception.ptr.field_1.value.description.content.size_;
    local_188.description.content.disposer =
         local_450.exception.ptr.field_1.value.description.content.disposer;
    local_450.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_450.exception.ptr.field_1.value.description.content.size_ = 0;
    local_188.context.ptr.disposer = local_450.exception.ptr.field_1.value.context.ptr.disposer;
    local_188.context.ptr.ptr = local_450.exception.ptr.field_1.value.context.ptr.ptr;
    local_450.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_188.trace,__src,0x104);
    local_2e8.ownFile.content.ptr = (char *)uVar1;
    local_2e8.ownFile.content.size_ = uVar2;
    local_2e8.ownFile.content.disposer =
         local_450.exception.ptr.field_1.value.ownFile.content.disposer;
    local_188.ownFile.content.ptr = (char *)0x0;
    local_188.ownFile.content.size_ = 0;
    local_2e8.file = local_450.exception.ptr.field_1.value.file;
    local_2e8.line = local_450.exception.ptr.field_1.value.line;
    local_2e8.type = local_450.exception.ptr.field_1.value.type;
    local_2e8.description.content.ptr = (char *)uVar3;
    local_2e8.description.content.size_ = uVar4;
    local_2e8.description.content.disposer =
         local_450.exception.ptr.field_1.value.description.content.disposer;
    local_188.description.content.ptr = (char *)0x0;
    local_188.description.content.size_ = 0;
    local_2e8.context.ptr.disposer = local_450.exception.ptr.field_1.value.context.ptr.disposer;
    local_2e8.context.ptr.ptr = (Context *)uVar5;
    local_188.context.ptr.ptr = (Context *)0x0;
    memcpy(local_2e8.trace,__src,0x104);
    local_5b8.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_5b8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr = (char *)uVar1
    ;
    local_5b8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ = uVar2;
    local_5b8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_450.exception.ptr.field_1.value.ownFile.content.disposer;
    local_2e8.ownFile.content.ptr = (char *)0x0;
    local_2e8.ownFile.content.size_ = 0;
    local_5b8.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_450.exception.ptr.field_1.value.file;
    local_5b8.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_450.exception.ptr.field_1._32_8_;
    local_5b8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (char *)uVar3;
    local_5b8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ = uVar4;
    local_5b8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_450.exception.ptr.field_1.value.description.content.disposer;
    local_2e8.description.content.ptr = (char *)0x0;
    local_2e8.description.content.size_ = 0;
    local_5b8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_450.exception.ptr.field_1.value.context.ptr.disposer;
    local_5b8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar5;
    local_2e8.context.ptr.ptr = (Context *)0x0;
    memcpy((void *)((long)&local_5b8.super_ExceptionOrValue.exception.ptr.field_1 + 0x50),__src,
           0x104);
    local_5b8.value.ptr.isSet = false;
    Exception::~Exception(&local_2e8);
    ExceptionOr<int>::operator=((ExceptionOr<int> *)output,&local_5b8);
    if (local_5b8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_5b8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    Exception::~Exception(&local_188);
  }
  else if (local_2f0 == '\x01') {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[4]>
              ((Fault *)&local_2e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x5b,FAILED,(char *)0x0,"\"foo\"",(char (*) [4])0x3a5188);
    Debug::Fault::~Fault((Fault *)&local_2e8);
    local_5b8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_5b8.value.ptr.isSet = true;
    local_5b8.value.ptr.field_1.value = 0x7b;
    ExceptionOr<int>::operator=((ExceptionOr<int> *)output,&local_5b8);
    if (local_5b8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_5b8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
  }
  if (local_450.exception.ptr.isSet == true) {
    Exception::~Exception(&local_450.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }